

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::Branch::fire(Branch *this)

{
  PromiseArenaMember *node;
  byte bVar1;
  Event *in_RDX;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  long in_RSI;
  long lVar2;
  long lVar3;
  int iVar4;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar5;
  
  lVar3 = *(long *)(in_RSI + 0x40);
  if (*(char *)(lVar3 + 0x28) == '\x01') goto LAB_003fa1bb;
  iVar4 = *(int *)(lVar3 + 0x18) + -1;
  *(int *)(lVar3 + 0x18) = iVar4;
  (**(code **)(**(long **)(in_RSI + 0x48) + 0x18))
            (*(long **)(in_RSI + 0x48),*(undefined8 *)(lVar3 + 0x10));
  lVar3 = *(long *)(in_RSI + 0x40);
  bVar1 = 1;
  in_RDX = extraout_RDX;
  if (**(char **)(lVar3 + 0x10) == '\0') {
    if (*(long *)(lVar3 + 0x38) != 0) {
      lVar2 = *(long *)(lVar3 + 0x30);
      lVar3 = *(long *)(lVar3 + 0x38) * 0x50;
      do {
        if ((lVar2 != in_RSI) &&
           (node = *(PromiseArenaMember **)(lVar2 + 0x48), node != (PromiseArenaMember *)0x0)) {
          *(undefined8 *)(lVar2 + 0x48) = 0;
          PromiseDisposer::dispose(node);
          in_RDX = extraout_RDX_00;
        }
        lVar2 = lVar2 + 0x50;
        lVar3 = lVar3 + -0x50;
      } while (lVar3 != 0);
      lVar3 = *(long *)(in_RSI + 0x40);
      bVar1 = **(byte **)(lVar3 + 0x10);
      goto LAB_003fa1a5;
    }
  }
  else {
LAB_003fa1a5:
    if (((bVar1 & 1) != 0) && (iVar4 != 0)) goto LAB_003fa1bb;
  }
  *(undefined1 *)(lVar3 + 0x28) = 1;
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(lVar3 + 0x20));
  in_RDX = extraout_RDX_01;
LAB_003fa1bb:
  (this->super_Event)._vptr_Event = (_func_int **)0x0;
  (this->super_Event).loop = (EventLoop *)0x0;
  MVar5.ptr.ptr = in_RDX;
  MVar5.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar5.ptr;
}

Assistant:

Maybe<Own<Event>> RaceSuccessfulPromiseNodeBase::Branch::fire() {
  if (parent.armed) {
    // the parent node has already received the value, no need to bother with
    // anything
    return kj::none;
  }

  auto count = --parent.countLeft;
  promise->get(parent.output);

  if (parent.output.exception == kj::none) {
    // our promise was successful

    // cancel the others, ignore errors caused by cancellations
    for (auto& otherBranch: parent.branches) {
      if (this != &otherBranch) {
        kj::runCatchingExceptions([&]() { otherBranch.promise = nullptr; });
      }
    }
  }

  if (parent.output.exception == kj::none || count == 0) {
    // we're either successful or the only one left, trigger the parent
    parent.armed = true;
    parent.onReadyEvent.arm();
  }

  return kj::none;
}